

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
::ConvertConstraint(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
                    *this,Container *cnt,int i)

{
  Context CVar1;
  
  CVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          RunConversion<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::SinId>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)this->cvt_,
                     (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>
                      *)cnt,i,cnt->depth_);
  (cnt->ctx_redef_).value_ = CVar1.value_;
  if (cnt->is_bridged_ == '\0') {
    cnt->is_bridged_ = '\x01';
    this->n_bridged_or_unused_ = this->n_bridged_or_unused_ + 1;
  }
  return;
}

Assistant:

void ConvertConstraint(Container& cnt, int i) {
    assert(!cnt.IsRedundant());
    assert(cnt.GetRedefContext().IsNone());
    auto ctx_redef
        = GetConverter().RunConversion(cnt.GetCon(), i, cnt.GetDepth());
    cnt.SetRedefContext(ctx_redef);
    assert(!cnt.GetCon().HasResultVar()
           || cnt.GetCon().GetContext().IsSubsetOf(ctx_redef));
    MarkAsBridged(cnt, i);
  }